

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O2

extrapolation_t *
tchecker::zg::extrapolation_factory
          (extrapolation_type_t extrapolation_type,clockbounds_t *clock_bounds)

{
  extrapolation_t *peVar1;
  local_extra_lu_plus_t *this;
  invalid_argument *this_00;
  
  switch(extrapolation_type) {
  case NO_EXTRAPOLATION:
    peVar1 = (extrapolation_t *)operator_new(8);
    peVar1->_vptr_extrapolation_t = (_func_int **)&PTR__extrapolation_t_00290a28;
    return peVar1;
  case EXTRA_LU_GLOBAL:
    this = (local_extra_lu_plus_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_lu_map((clockbounds_t *)&stack0xffffffffffffffe0);
    global_extra_lu_t::global_lu_extrapolation_t
              ((global_extra_lu_t *)this,
               (shared_ptr<const_tchecker::clockbounds::global_lu_map_t> *)&stack0xffffffffffffffe0)
    ;
    break;
  case EXTRA_LU_LOCAL:
    this = (local_extra_lu_plus_t *)operator_new(0x28);
    clockbounds::clockbounds_t::local_lu_map((clockbounds_t *)&stack0xffffffffffffffe0);
    local_extra_lu_t::local_lu_extrapolation_t
              ((local_extra_lu_t *)this,
               (shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *)&stack0xffffffffffffffe0);
    break;
  case EXTRA_LU_PLUS_GLOBAL:
    this = (local_extra_lu_plus_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_lu_map((clockbounds_t *)&stack0xffffffffffffffe0);
    global_extra_lu_plus_t::global_lu_extrapolation_t
              ((global_extra_lu_plus_t *)this,
               (shared_ptr<const_tchecker::clockbounds::global_lu_map_t> *)&stack0xffffffffffffffe0)
    ;
    break;
  case EXTRA_LU_PLUS_LOCAL:
    this = (local_extra_lu_plus_t *)operator_new(0x28);
    clockbounds::clockbounds_t::local_lu_map((clockbounds_t *)&stack0xffffffffffffffe0);
    local_extra_lu_plus_t::local_lu_extrapolation_t
              (this,(shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *)
                    &stack0xffffffffffffffe0);
    break;
  case EXTRA_M_GLOBAL:
    this = (local_extra_lu_plus_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_m_map((clockbounds_t *)&stack0xffffffffffffffe0);
    global_extra_m_t::global_m_extrapolation_t
              ((global_extra_m_t *)this,
               (shared_ptr<const_tchecker::clockbounds::global_m_map_t> *)&stack0xffffffffffffffe0);
    break;
  case EXTRA_M_LOCAL:
    this = (local_extra_lu_plus_t *)operator_new(0x20);
    clockbounds::clockbounds_t::local_m_map((clockbounds_t *)&stack0xffffffffffffffe0);
    local_extra_m_t::local_m_extrapolation_t
              ((local_extra_m_t *)this,
               (shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)&stack0xffffffffffffffe0);
    break;
  case EXTRA_M_PLUS_GLOBAL:
    this = (local_extra_lu_plus_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_m_map((clockbounds_t *)&stack0xffffffffffffffe0);
    global_extra_m_plus_t::global_m_extrapolation_t
              ((global_extra_m_plus_t *)this,
               (shared_ptr<const_tchecker::clockbounds::global_m_map_t> *)&stack0xffffffffffffffe0);
    break;
  case EXTRA_M_PLUS_LOCAL:
    this = (local_extra_lu_plus_t *)operator_new(0x20);
    clockbounds::clockbounds_t::local_m_map((clockbounds_t *)&stack0xffffffffffffffe0);
    local_extra_m_plus_t::local_m_extrapolation_t
              ((local_extra_m_plus_t *)this,
               (shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)&stack0xffffffffffffffe0);
    break;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown zone extrapolation");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return (extrapolation_t *)this;
}

Assistant:

tchecker::zg::extrapolation_t * extrapolation_factory(enum extrapolation_type_t extrapolation_type,
                                                      tchecker::clockbounds::clockbounds_t const & clock_bounds)
{
  if (extrapolation_type == tchecker::zg::NO_EXTRAPOLATION)
    return new tchecker::zg::no_extrapolation_t;
  switch (extrapolation_type) {
  case tchecker::zg::EXTRA_LU_GLOBAL:
    return new tchecker::zg::global_extra_lu_t{clock_bounds.global_lu_map()};
  case tchecker::zg::EXTRA_LU_LOCAL:
    return new tchecker::zg::local_extra_lu_t{clock_bounds.local_lu_map()};
  case tchecker::zg::EXTRA_LU_PLUS_GLOBAL:
    return new tchecker::zg::global_extra_lu_plus_t{clock_bounds.global_lu_map()};
  case tchecker::zg::EXTRA_LU_PLUS_LOCAL:
    return new tchecker::zg::local_extra_lu_plus_t{clock_bounds.local_lu_map()};
  case tchecker::zg::EXTRA_M_GLOBAL:
    return new tchecker::zg::global_extra_m_t{clock_bounds.global_m_map()};
  case tchecker::zg::EXTRA_M_LOCAL:
    return new tchecker::zg::local_extra_m_t{clock_bounds.local_m_map()};
  case tchecker::zg::EXTRA_M_PLUS_GLOBAL:
    return new tchecker::zg::global_extra_m_plus_t{clock_bounds.global_m_map()};
  case tchecker::zg::EXTRA_M_PLUS_LOCAL:
    return new tchecker::zg::local_extra_m_plus_t{clock_bounds.local_m_map()};
  default:
    throw std::invalid_argument("Unknown zone extrapolation");
  }
}